

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O0

void fe::operations::applyOperation<fe::operations::op_blit_colored>
               (op_blit_colored *op,ImageData *src,ImageData *dest)

{
  PixelDISTANCE local_24;
  PixelB8G8R8A8 local_23;
  PixelR8G8B8A8 local_22;
  PixelA8 local_21;
  PixelDISTANCE s_3;
  PixelB8G8R8A8 s_2;
  PixelR8G8B8A8 s_1;
  ImageData *pIStack_20;
  PixelA8 s;
  ImageData *dest_local;
  ImageData *src_local;
  op_blit_colored *op_local;
  
  pIStack_20 = dest;
  switch((src->super_fe_image).format) {
  case FE_IMG_A8:
    SwitchSrcDestT<fe::PixelA8,fe::operations::op_blit_colored>(op,&local_21,src,dest);
    break;
  default:
    __assert_fail("!\"unknown format\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/ImageDataOperations.h"
                  ,0x183,
                  "void fe::operations::applyOperation(const Op &, const ImageData &, const ImageData &) [Op = fe::operations::op_blit_colored]"
                 );
  case FE_IMG_R8G8B8A8:
    SwitchSrcDestT<fe::PixelR8G8B8A8,fe::operations::op_blit_colored>(op,&local_22,src,dest);
    break;
  case FE_IMG_B8G8R8A8:
    SwitchSrcDestT<fe::PixelB8G8R8A8,fe::operations::op_blit_colored>(op,&local_23,src,dest);
    break;
  case FE_IMG_DISTANCE:
    SwitchSrcDestT<fe::PixelDISTANCE,fe::operations::op_blit_colored>(op,&local_24,src,dest);
  }
  return;
}

Assistant:

void applyOperation(const Op& op, const ImageData& src, const ImageData& dest)
        {
#define FORMAT_CASE FORMAT_OP2
            ALL_FORMATS_SWITCH(src.format);
#undef FORMAT_CASE
        }